

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls_test.cpp
# Opt level: O2

void __thiscall
ot::commissioner::DtlsTest_MbedtlsClientServer_Test::TestBody
          (DtlsTest_MbedtlsClientServer_Test *this)

{
  ByteArray *this_00;
  ByteArray *this_01;
  ByteArray *this_02;
  UdpSocket *this_03;
  event_base *peVar1;
  char *pcVar2;
  initializer_list<unsigned_char> __l;
  AssertHelper local_1a48;
  AssertionResult gtest_ar_4;
  event_base *eventBase;
  AssertionResult gtest_ar_2;
  shared_ptr<ot::commissioner::UdpSocket> clientSocket;
  int fail;
  shared_ptr<ot::commissioner::UdpSocket> serverSocket;
  __shared_ptr<ot::commissioner::Socket,(__gnu_cxx::_Lock_policy)2> local_19d8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_19d0;
  __shared_ptr<ot::commissioner::Socket,(__gnu_cxx::_Lock_policy)2> local_19c8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_19c0;
  DtlsConfig config;
  ByteArray kHello;
  _Any_data local_1938;
  code *local_1928;
  code *local_1920;
  _Any_data local_1910;
  code *local_1900;
  code *local_18f8;
  _Any_data local_18f0;
  code *local_18e0;
  code *local_18d8;
  DtlsSession dtlsClient;
  DtlsSession dtlsServer;
  
  dtlsServer.super_Endpoint._vptr_Endpoint._0_4_ = 0x6c6c6568;
  dtlsServer.super_Endpoint._vptr_Endpoint._4_1_ = 0x6f;
  __l._M_len = 5;
  __l._M_array = (iterator)&dtlsServer;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&kHello,__l,(allocator_type *)&dtlsClient);
  config.mEnableDebugLogging = false;
  config.mLogLevel = 3;
  config.mPSK.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  config.mPSK.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  config.mPSK.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  config.mOwnKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  config.mOwnKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  config.mOwnKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  config.mOwnCert.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  config.mOwnCert.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  config.mOwnCert.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  config.mCaChain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  config.mCaChain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  config.mCaChain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&dtlsServer,
             kServerTrustAnchor_abi_cxx11_,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(kServerTrustAnchor_abi_cxx11_._M_current + DAT_0025bc28),
             (allocator_type *)&dtlsClient);
  this_00 = &config.mCaChain;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(this_00,&dtlsServer);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&dtlsServer);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&dtlsServer,
             kServerCert_abi_cxx11_,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(kServerCert_abi_cxx11_._M_current + DAT_0025bc48),(allocator_type *)&dtlsClient);
  this_01 = &config.mOwnCert;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(this_01,&dtlsServer);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&dtlsServer);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&dtlsServer,
             kServerKey_abi_cxx11_,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(kServerKey_abi_cxx11_._M_current + DAT_0025bc68),(allocator_type *)&dtlsClient);
  this_02 = &config.mOwnKey;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(this_02,&dtlsServer);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&dtlsServer);
  dtlsServer.super_Endpoint._vptr_Endpoint._0_4_ =
       (uint)dtlsServer.super_Endpoint._vptr_Endpoint & 0xffffff00;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (this_00,(uchar *)&dtlsServer);
  dtlsServer.super_Endpoint._vptr_Endpoint._0_4_ =
       (uint)dtlsServer.super_Endpoint._vptr_Endpoint & 0xffffff00;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (this_01,(uchar *)&dtlsServer);
  dtlsServer.super_Endpoint._vptr_Endpoint._0_4_ =
       (uint)dtlsServer.super_Endpoint._vptr_Endpoint & 0xffffff00;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (this_02,(uchar *)&dtlsServer);
  eventBase = event_base_new();
  dtlsClient.super_Endpoint._vptr_Endpoint = (_func_int **)0x0;
  testing::internal::CmpHelperNE<event_base*,decltype(nullptr)>
            ((internal *)&dtlsServer,"eventBase","nullptr",&eventBase,(void **)&dtlsClient);
  if ((char)dtlsServer.super_Endpoint._vptr_Endpoint == '\0') {
    testing::Message::Message((Message *)&dtlsClient);
    if (dtlsServer.super_Endpoint.mReceiver.super__Function_base._M_functor._M_unused._M_object ==
        (void *)0x0) {
      pcVar2 = anon_var_dwarf_307b52 + 9;
    }
    else {
      pcVar2 = *dtlsServer.super_Endpoint.mReceiver.super__Function_base._M_functor._M_unused.
                _M_object;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/dtls_test.cpp"
               ,0x7d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&dtlsClient);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    if (dtlsClient.super_Endpoint._vptr_Endpoint != (_func_int **)0x0) {
      (**(code **)(*dtlsClient.super_Endpoint._vptr_Endpoint + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&dtlsServer.super_Endpoint.mReceiver);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&dtlsServer.super_Endpoint.mReceiver);
    std::make_shared<ot::commissioner::UdpSocket,event_base*&>((event_base **)&serverSocket);
    std::__cxx11::string::string((string *)&dtlsServer,"::",(allocator *)&gtest_ar_4);
    gtest_ar_2._0_4_ =
         UdpSocket::Bind(serverSocket.
                         super___shared_ptr<ot::commissioner::UdpSocket,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,(string *)&dtlsServer,0x1633);
    clientSocket.super___shared_ptr<ot::commissioner::UdpSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
    _0_4_ = 0;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&dtlsClient,"serverSocket->Bind(kServerAddr, kServerPort)","0",
               (int *)&gtest_ar_2,(int *)&clientSocket);
    std::__cxx11::string::~string((string *)&dtlsServer);
    if ((char)dtlsClient.super_Endpoint._vptr_Endpoint == '\0') {
      testing::Message::Message((Message *)&dtlsServer);
      if (dtlsClient.super_Endpoint.mReceiver.super__Function_base._M_functor._M_unused._M_object ==
          (void *)0x0) {
        pcVar2 = anon_var_dwarf_307b52 + 9;
      }
      else {
        pcVar2 = *dtlsClient.super_Endpoint.mReceiver.super__Function_base._M_functor._M_unused.
                  _M_object;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/dtls_test.cpp"
                 ,0x80,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&dtlsServer)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
      if ((long *)CONCAT44(dtlsServer.super_Endpoint._vptr_Endpoint._4_4_,
                           (uint)dtlsServer.super_Endpoint._vptr_Endpoint) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(dtlsServer.super_Endpoint._vptr_Endpoint._4_4_,
                                       (uint)dtlsServer.super_Endpoint._vptr_Endpoint) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&dtlsClient.super_Endpoint.mReceiver);
    peVar1 = eventBase;
    std::__shared_ptr<ot::commissioner::Socket,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<ot::commissioner::UdpSocket,void>
              (local_19c8,
               &serverSocket.
                super___shared_ptr<ot::commissioner::UdpSocket,_(__gnu_cxx::_Lock_policy)2>);
    DtlsSession::DtlsSession(&dtlsServer,peVar1,true,(SocketPtr *)local_19c8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_19c0);
    DtlsSession::Init((Error *)&dtlsClient,&dtlsServer,&config);
    clientSocket.super___shared_ptr<ot::commissioner::UdpSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
    _0_4_ = 0;
    testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
              ((internal *)&gtest_ar_2,"dtlsServer.Init(config)","ErrorCode::kNone",
               (Error *)&dtlsClient,(ErrorCode *)&clientSocket);
    std::__cxx11::string::~string((string *)&dtlsClient.super_Endpoint.mReceiver);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&dtlsClient);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_2.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar2 = anon_var_dwarf_307b52 + 9;
      }
      else {
        pcVar2 = *(char **)gtest_ar_2.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&clientSocket,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/dtls_test.cpp"
                 ,0x83,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&clientSocket,(Message *)&dtlsClient);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&clientSocket);
      if (dtlsClient.super_Endpoint._vptr_Endpoint != (_func_int **)0x0) {
        (**(code **)(*dtlsClient.super_Endpoint._vptr_Endpoint + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_2.message_);
    local_18f0._8_8_ = eventBase;
    local_18d8 = std::
                 _Function_handler<void_(ot::commissioner::Endpoint_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/dtls_test.cpp:133:28)>
                 ::_M_invoke;
    local_18e0 = std::
                 _Function_handler<void_(ot::commissioner::Endpoint_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/dtls_test.cpp:133:28)>
                 ::_M_manager;
    local_18f0._M_unused._M_object = &kHello;
    std::
    function<void_(ot::commissioner::Endpoint_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
    ::operator=(&dtlsServer.super_Endpoint.mReceiver,
                (function<void_(ot::commissioner::Endpoint_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                 *)&local_18f0);
    std::_Function_base::~_Function_base((_Function_base *)&local_18f0);
    local_1938._M_unused._M_object = (void *)0x0;
    local_1938._8_8_ = 0;
    local_1920 = std::
                 _Function_handler<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/dtls_test.cpp:139:28)>
                 ::_M_invoke;
    local_1928 = std::
                 _Function_handler<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/dtls_test.cpp:139:28)>
                 ::_M_manager;
    DtlsSession::Connect(&dtlsServer,(ConnectHandler *)&local_1938);
    std::_Function_base::~_Function_base((_Function_base *)&local_1938);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&dtlsClient,
               kClientTrustAnchor_abi_cxx11_,
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(kClientTrustAnchor_abi_cxx11_._M_current + DAT_0025bbc8),
               (allocator_type *)&gtest_ar_2);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(this_00,&dtlsClient);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&dtlsClient);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&dtlsClient,
               kClientCert_abi_cxx11_,
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(kClientCert_abi_cxx11_._M_current + DAT_0025bbe8),(allocator_type *)&gtest_ar_2);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(this_01,&dtlsClient);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&dtlsClient);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&dtlsClient,
               kClientKey_abi_cxx11_,
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(kClientKey_abi_cxx11_._M_current + DAT_0025bc08),(allocator_type *)&gtest_ar_2);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(this_02,&dtlsClient);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&dtlsClient);
    dtlsClient.super_Endpoint._vptr_Endpoint =
         (_func_int **)((ulong)dtlsClient.super_Endpoint._vptr_Endpoint & 0xffffffffffffff00);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (this_00,(uchar *)&dtlsClient);
    dtlsClient.super_Endpoint._vptr_Endpoint =
         (_func_int **)((ulong)dtlsClient.super_Endpoint._vptr_Endpoint & 0xffffffffffffff00);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (this_01,(uchar *)&dtlsClient);
    dtlsClient.super_Endpoint._vptr_Endpoint =
         (_func_int **)((ulong)dtlsClient.super_Endpoint._vptr_Endpoint & 0xffffffffffffff00);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (this_02,(uchar *)&dtlsClient);
    std::make_shared<ot::commissioner::UdpSocket,event_base*&>((event_base **)&clientSocket);
    this_03 = (UdpSocket *)
              CONCAT44(clientSocket.
                       super___shared_ptr<ot::commissioner::UdpSocket,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr._4_4_,
                       clientSocket.
                       super___shared_ptr<ot::commissioner::UdpSocket,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr._0_4_);
    std::__cxx11::string::string((string *)&dtlsClient,"::",(allocator *)&fail);
    gtest_ar_4._0_4_ = UdpSocket::Connect(this_03,(string *)&dtlsClient,0x1633);
    local_1a48.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar_2,"clientSocket->Connect(kServerAddr, kServerPort)","0",
               (int *)&gtest_ar_4,(int *)&local_1a48);
    std::__cxx11::string::~string((string *)&dtlsClient);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&dtlsClient);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_2.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar2 = anon_var_dwarf_307b52 + 9;
      }
      else {
        pcVar2 = *(char **)gtest_ar_2.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/dtls_test.cpp"
                 ,0x9b,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&dtlsClient)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
      if (dtlsClient.super_Endpoint._vptr_Endpoint != (_func_int **)0x0) {
        (**(code **)(*dtlsClient.super_Endpoint._vptr_Endpoint + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_2.message_);
    peVar1 = eventBase;
    std::__shared_ptr<ot::commissioner::Socket,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<ot::commissioner::UdpSocket,void>
              (local_19d8,
               &clientSocket.
                super___shared_ptr<ot::commissioner::UdpSocket,_(__gnu_cxx::_Lock_policy)2>);
    DtlsSession::DtlsSession(&dtlsClient,peVar1,false,(SocketPtr *)local_19d8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_19d0);
    DtlsSession::Init((Error *)&gtest_ar_2,&dtlsClient,&config);
    local_1a48.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
              ((internal *)&gtest_ar_4,"dtlsClient.Init(config)","ErrorCode::kNone",
               (Error *)&gtest_ar_2,(ErrorCode *)&local_1a48);
    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
    if (gtest_ar_4.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_2);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_4.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar2 = anon_var_dwarf_307b52 + 9;
      }
      else {
        pcVar2 = *(char **)gtest_ar_4.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1a48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/dtls_test.cpp"
                 ,0x9e,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1a48,(Message *)&gtest_ar_2);
      testing::internal::AssertHelper::~AssertHelper(&local_1a48);
      if ((long *)CONCAT44(gtest_ar_2._4_4_,gtest_ar_2._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar_2._4_4_,gtest_ar_2._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_4.message_);
    local_1910._8_8_ = 0;
    local_18f8 = std::
                 _Function_handler<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/dtls_test.cpp:160:28)>
                 ::_M_invoke;
    local_1900 = std::
                 _Function_handler<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/dtls_test.cpp:160:28)>
                 ::_M_manager;
    local_1910._M_unused._M_object = &kHello;
    DtlsSession::Connect(&dtlsClient,(ConnectHandler *)&local_1910);
    std::_Function_base::~_Function_base((_Function_base *)&local_1910);
    fail = event_base_loop(eventBase,4);
    gtest_ar_4.success_ = false;
    gtest_ar_4._1_3_ = 0;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar_2,"fail","0",&fail,(int *)&gtest_ar_4);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_4);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_2.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar2 = anon_var_dwarf_307b52 + 9;
      }
      else {
        pcVar2 = *(char **)gtest_ar_2.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1a48,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/dtls_test.cpp"
                 ,0xa8,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1a48,(Message *)&gtest_ar_4);
      testing::internal::AssertHelper::~AssertHelper(&local_1a48);
      if ((long *)CONCAT44(gtest_ar_4._4_4_,gtest_ar_4._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar_4._4_4_,gtest_ar_4._0_4_) + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_2.message_);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_2.message_);
      event_base_free(eventBase);
    }
    DtlsSession::~DtlsSession(&dtlsClient);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&clientSocket.
                super___shared_ptr<ot::commissioner::UdpSocket,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    DtlsSession::~DtlsSession(&dtlsServer);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&serverSocket.
                super___shared_ptr<ot::commissioner::UdpSocket,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  DtlsConfig::~DtlsConfig(&config);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&kHello.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

TEST(DtlsTest, MbedtlsClientServer)
{
    const ByteArray kHello{'h', 'e', 'l', 'l', 'o'};

    DtlsConfig config;

    // Setup dtls server
    config.mCaChain = ByteArray{kServerTrustAnchor.begin(), kServerTrustAnchor.end()};
    config.mOwnCert = ByteArray{kServerCert.begin(), kServerCert.end()};
    config.mOwnKey  = ByteArray{kServerKey.begin(), kServerKey.end()};

    config.mCaChain.push_back(0);
    config.mOwnCert.push_back(0);
    config.mOwnKey.push_back(0);

    auto eventBase = event_base_new();
    ASSERT_NE(eventBase, nullptr);

    auto serverSocket = std::make_shared<UdpSocket>(eventBase);
    EXPECT_EQ(serverSocket->Bind(kServerAddr, kServerPort), 0);

    DtlsSession dtlsServer{eventBase, true, serverSocket};
    EXPECT_EQ(dtlsServer.Init(config), ErrorCode::kNone);

    dtlsServer.SetReceiver([&kHello, eventBase](Endpoint &, const ByteArray &aBuf) {
        EXPECT_EQ(aBuf, kHello);

        event_base_loopbreak(eventBase);
    });

    auto serverConnected = [](const DtlsSession &aSession, Error aError) {
        EXPECT_EQ(aError, ErrorCode::kNone);
        EXPECT_EQ(aSession.GetState(), DtlsSession::State::kConnected);
    };
    dtlsServer.Connect(serverConnected);

    // Setup dtls client
    config.mCaChain = ByteArray{kClientTrustAnchor.begin(), kClientTrustAnchor.end()};
    config.mOwnCert = ByteArray{kClientCert.begin(), kClientCert.end()};
    config.mOwnKey  = ByteArray{kClientKey.begin(), kClientKey.end()};

    config.mCaChain.push_back(0);
    config.mOwnCert.push_back(0);
    config.mOwnKey.push_back(0);

    auto clientSocket = std::make_shared<UdpSocket>(eventBase);
    EXPECT_EQ(clientSocket->Connect(kServerAddr, kServerPort), 0);

    DtlsSession dtlsClient{eventBase, false, clientSocket};
    EXPECT_EQ(dtlsClient.Init(config), ErrorCode::kNone);

    auto clientConnected = [&kHello](DtlsSession &aSession, Error aError) {
        EXPECT_EQ(aError, ErrorCode::kNone);
        EXPECT_EQ(aSession.GetState(), DtlsSession::State::kConnected);
        EXPECT_EQ(aSession.Send(kHello, MessageSubType::kNone), ErrorCode::kNone);
    };
    dtlsClient.Connect(clientConnected);

    int fail = event_base_loop(eventBase, EVLOOP_NO_EXIT_ON_EMPTY);
    ASSERT_EQ(fail, 0);
    event_base_free(eventBase);
}